

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

bool __thiscall irr::gui::CGUITabControl::setActiveTab(CGUITabControl *this,s32 idx)

{
  int iVar1;
  s32 sVar2;
  uint uVar3;
  SEvent event;
  
  uVar3 = (uint)((ulong)((long)(this->Tabs).m_data.
                               super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Tabs).m_data.
                              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((uint)idx < uVar3) {
    iVar1 = this->ActiveTabIndex;
    this->ActiveTabIndex = idx;
    setVisibleTab(this,idx);
    if ((iVar1 != idx) && (*(long **)&this->field_0x20 != (long *)0x0)) {
      (**(code **)(**(long **)&this->field_0x20 + 0x10))();
    }
    if (this->ScrollControl == true) {
      sVar2 = calculateScrollIndexFromActive(this);
      this->CurrentScrollTabIndex = sVar2;
      recalculateScrollBar(this);
    }
  }
  return (uint)idx < uVar3;
}

Assistant:

bool CGUITabControl::setActiveTab(s32 idx)
{
	if ((u32)idx >= Tabs.size())
		return false;

	bool changed = (ActiveTabIndex != idx);

	ActiveTabIndex = idx;

	setVisibleTab(ActiveTabIndex);

	if (changed && Parent) {
		SEvent event;
		event.EventType = EET_GUI_EVENT;
		event.GUIEvent.Caller = this;
		event.GUIEvent.Element = 0;
		event.GUIEvent.EventType = EGET_TAB_CHANGED;
		Parent->OnEvent(event);
	}

	if (ScrollControl) {
		CurrentScrollTabIndex = calculateScrollIndexFromActive();
		recalculateScrollBar();
	}

	return true;
}